

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cc
# Opt level: O1

void __thiscall re2c::Input::~Input(Input *this)

{
  FILE *__stream;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  __stream = (FILE *)this->file;
  if ((__stream != (FILE *)0x0) && (__stream != _stdin)) {
    fclose(__stream);
  }
  pcVar1 = (this->file_name)._M_dataplus._M_p;
  paVar2 = &(this->file_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Input::~Input ()
{
	if (file != NULL && file != stdin)
	{
		fclose (file);
	}
}